

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRle.cpp
# Opt level: O2

void testRle(string *param_1)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  char cVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  double dVar13;
  Rand48 local_4e;
  signed *local_48;
  int local_3c;
  Rand48 rand48;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"RLE compression:");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"   Round tripping buffers ");
  std::endl<char,std::char_traits<char>>(poVar5);
  rand48._state[0] = 0x5a5a;
  rand48._state[1] = 0x5a5a;
  rand48._state[2] = 0x5a5a;
  local_3c = 0;
  do {
    if (local_3c == 1000) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar5);
      return;
    }
    dVar13 = Imath_3_2::Rand48::nextf(&rand48,100.0,1000000.0);
    uVar12 = (uint)dVar13;
    uVar8 = (ulong)(int)uVar12;
    pcVar6 = (char *)operator_new__(uVar8);
    local_48 = (signed *)operator_new__((long)(int)(uVar12 * 2));
    pcVar7 = (char *)operator_new__(uVar8);
    local_4e._state[0] = 0x5a5a;
    local_4e._state[1] = 0x5a5a;
    local_4e._state[2] = 0x5a5a;
    uVar11 = 0;
    cVar9 = '\0';
    while (iVar4 = (int)uVar11, iVar4 < (int)uVar12) {
      dVar13 = (double)Imath_3_2::erand48(local_4e._state);
      if (0.5 <= dVar13) {
        dVar13 = Imath_3_2::Rand48::nextf(&local_4e,2.0,1024.0);
        iVar3 = (int)dVar13;
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        uVar10 = (long)iVar4;
        do {
          uVar11 = (long)(iVar3 + iVar4);
          if ((long)(iVar3 + iVar4) == uVar10) break;
          pcVar6[uVar10] = cVar9;
          uVar11 = uVar10 + 1;
          uVar10 = uVar11;
        } while ((long)uVar11 < (long)uVar8);
      }
      else {
        pcVar6[iVar4] = cVar9;
        uVar11 = (ulong)(iVar4 + 1);
      }
      cVar9 = cVar9 + '\x01';
    }
    iVar4 = Imf_3_4::rleCompress(uVar12,pcVar6,local_48);
    iVar4 = Imf_3_4::rleUncompress(iVar4,uVar12,local_48,pcVar7);
    if (iVar4 < 1) {
      pcVar6 = "rleUncompress (compressedLen, bufferLen, compressed, test) > 0";
      uVar12 = 0x45;
LAB_0017ed29:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testRle.cpp"
                    ,uVar12,"void (anonymous namespace)::testRoundTrip(int)");
    }
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    uVar11 = 0;
    while (uVar12 != uVar11) {
      pcVar1 = pcVar6 + uVar11;
      pcVar2 = pcVar7 + uVar11;
      uVar11 = uVar11 + 1;
      if (*pcVar1 != *pcVar2) {
        pcVar6 = "src[i] == test[i]";
        uVar12 = 0x49;
        goto LAB_0017ed29;
      }
    }
    operator_delete__(pcVar6);
    operator_delete__(local_48);
    operator_delete__(pcVar7);
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void
testRle (const string&)
{
    cout << "RLE compression:" << endl;

    try
    {

        cout << "   Round tripping buffers " << endl;

        const int numIter = 1000;
        Rand48    rand48 (0);

        for (int iter = 0; iter < numIter; ++iter)
        {
            testRoundTrip ((int) rand48.nextf (100.0, 1000000.0));
        }
    }
    catch (const exception& e)
    {
        cout << "unexpected exception: " << e.what () << endl;
        assert (false);
    }
    catch (...)
    {
        cout << "unexpected exception" << endl;
        assert (false);
    }

    cout << "ok\n" << endl;
}